

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O1

void __thiscall
btAlignedObjectArray<NodeLinks>::resize
          (btAlignedObjectArray<NodeLinks> *this,int newsize,NodeLinks *fillData)

{
  int iVar1;
  NodeLinks *pNVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = this->m_size;
  if (newsize < iVar3) {
    lVar4 = (long)newsize << 5;
    iVar3 = iVar3 - newsize;
    do {
      btAlignedObjectArray<int>::~btAlignedObjectArray
                ((btAlignedObjectArray<int> *)(&(this->m_data->m_links).field_0x0 + lVar4));
      lVar4 = lVar4 + 0x20;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  else {
    if ((iVar3 < newsize) && (this->m_capacity < newsize)) {
      if (newsize == 0) {
        pNVar2 = (NodeLinks *)0x0;
      }
      else {
        pNVar2 = (NodeLinks *)btAlignedAllocInternal((long)newsize << 5,0x10);
      }
      iVar1 = this->m_size;
      if (0 < (long)iVar1) {
        lVar4 = 0;
        do {
          btAlignedObjectArray<int>::btAlignedObjectArray
                    ((btAlignedObjectArray<int> *)((long)&(pNVar2->m_links).field_0x0 + lVar4),
                     (btAlignedObjectArray<int> *)(&(this->m_data->m_links).field_0x0 + lVar4));
          lVar4 = lVar4 + 0x20;
        } while ((long)iVar1 * 0x20 != lVar4);
      }
      iVar1 = this->m_size;
      if (0 < (long)iVar1) {
        lVar4 = 0;
        do {
          btAlignedObjectArray<int>::~btAlignedObjectArray
                    ((btAlignedObjectArray<int> *)(&(this->m_data->m_links).field_0x0 + lVar4));
          lVar4 = lVar4 + 0x20;
        } while ((long)iVar1 * 0x20 != lVar4);
      }
      if (this->m_data != (NodeLinks *)0x0) {
        if (this->m_ownsMemory == true) {
          btAlignedFreeInternal(this->m_data);
        }
        this->m_data = (NodeLinks *)0x0;
      }
      this->m_ownsMemory = true;
      this->m_data = pNVar2;
      this->m_capacity = newsize;
    }
    if (iVar3 < newsize) {
      lVar4 = (long)iVar3 << 5;
      iVar3 = newsize - iVar3;
      do {
        btAlignedObjectArray<int>::btAlignedObjectArray
                  ((btAlignedObjectArray<int> *)(&(this->m_data->m_links).field_0x0 + lVar4),
                   &fillData->m_links);
        lVar4 = lVar4 + 0x20;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}